

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLine.cpp
# Opt level: O1

double __thiscall
chrono::geometry::ChLine::CurveSegmentDistMax(ChLine *this,ChLine *complinesegm,int samples)

{
  double approxU;
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChVector<double> ptA;
  ChVector<double> ptB;
  double mpos;
  double local_88;
  double dStack_80;
  double local_78;
  ChVector<double> local_68;
  double local_50;
  double local_48;
  ulong local_40;
  double local_38;
  undefined1 extraout_var [56];
  
  local_50 = 1.0 / (double)samples;
  auVar1 = ZEXT816(0);
  approxU = 0.0;
  do {
    local_40 = auVar1._0_8_;
    local_68.m_data[2] = 0.0;
    local_68.m_data[0] = 0.0;
    local_68.m_data[1] = 0.0;
    local_48 = approxU;
    (*(complinesegm->super_ChGeometry)._vptr_ChGeometry[0xb])(complinesegm,&local_68);
    FindNearestLinePoint(this,&local_68,&local_38,approxU,2e-05);
    local_78 = 0.0;
    local_88 = 0.0;
    dStack_80 = 0.0;
    (*(this->super_ChGeometry)._vptr_ChGeometry[0xb])(local_38,this,&local_88);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (dStack_80 - local_68.m_data[1]) * (dStack_80 - local_68.m_data[1]);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_88 - local_68.m_data[0];
    auVar1 = vfmadd231sd_fma(auVar1,auVar5,auVar5);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_78 - local_68.m_data[2];
    auVar1 = vfmadd231sd_fma(auVar1,auVar3,auVar3);
    if (auVar1._0_8_ < 0.0) {
      auVar2._0_8_ = sqrt(auVar1._0_8_);
      auVar2._8_56_ = extraout_var;
      auVar1 = auVar2._0_16_;
    }
    else {
      auVar1 = vsqrtsd_avx(auVar1,auVar1);
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_40;
    auVar1 = vmaxsd_avx(auVar1,auVar4);
    approxU = local_48 + local_50;
  } while (approxU < 1.0);
  return auVar1._0_8_;
}

Assistant:

double ChLine::CurveSegmentDistMax(ChLine* complinesegm, int samples) const {
    double mres = 0;
    double par;
    double mdis;
    // distances this<->compare_line
    for (par = 0; par < 1; par = par + 1 / ((double)samples)) {
        double mpos;
        ChVector<> ptB;
        complinesegm->Evaluate(ptB, par);
        this->FindNearestLinePoint(ptB, mpos, 0, 0.00002);
        ChVector<> ptA;
        this->Evaluate(ptA, mpos);
        mdis = Vlength(Vsub(ptA, ptB));
        if (mres < mdis)
            mres = mdis;
    }
    return (mres);
}